

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O3

long UnifInt(long nLow,long nHigh,long nStream)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = nHigh;
  if (nLow < nHigh) {
    lVar5 = nLow;
  }
  lVar3 = nLow - nHigh;
  if (nLow - nHigh == 0 || nLow < nHigh) {
    lVar3 = -(nLow - nHigh);
  }
  lVar6 = 0;
  if ((ulong)nStream < 0x32) {
    lVar6 = nStream;
  }
  lVar1 = (Seed[lVar6].value % 0x1f31d) * 0x41a7;
  lVar4 = (Seed[lVar6].value / 0x1f31d) * -0xb14;
  lVar2 = lVar1 + lVar4;
  lVar1 = lVar1 + lVar4 + 0x7fffffff;
  if (-1 < lVar2) {
    lVar1 = lVar2;
  }
  Seed[lVar6].value = lVar1;
  return (long)(((double)lVar1 / 2147483647.0) * (double)(lVar3 + 1)) + lVar5;
}

Assistant:

long
UnifInt(long nLow, long nHigh, long nStream)

/*
 * Returns an integer uniformly distributed between nLow and nHigh, 
 * including * the endpoints.  nStream is the random number stream.   
 * Stream 0 is used if nStream is not in the range 0..MAX_STREAM.
 */

{
    double          dRange;
    long            nTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;

    if (nLow > nHigh)
    {
        nTemp = nLow;
        nLow = nHigh;
        nHigh = nTemp;
    }

    dRange = (double) (nHigh - nLow + 1);
    Seed[nStream].value = NextRand(Seed[nStream].value);
    nTemp = (long) (((double) Seed[nStream].value / dM) * (dRange));
    return (nLow + nTemp);
}